

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O0

bool TtfUtil::GetComponentTransform
               (void *pSimpleGlyf,int nCompId,float *flt11,float *flt12,float *flt21,float *flt22,
               bool *fTransOffset)

{
  uint16 uVar1;
  uint16 uVar2;
  int iVar3;
  float *in_RCX;
  float *in_RDX;
  uint in_ESI;
  float *in_R8;
  float *in_R9;
  float fVar4;
  int nOffset;
  uint16 GlyphFlags;
  uint8 *pbGlyph;
  SimpleGlyph *pGlyph;
  undefined4 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  undefined2 in_stack_ffffffffffffffb6;
  
  iVar3 = GlyfContourCount((void *)CONCAT26(in_stack_ffffffffffffffb6,
                                            CONCAT24(in_stack_ffffffffffffffb4,
                                                     in_stack_ffffffffffffffb0)));
  if (iVar3 < 0) {
    do {
      uVar1 = read<unsigned_short>(0);
      uVar2 = read<unsigned_short>(0);
      if (uVar2 == in_ESI) {
        if ((*_nOffset & 1) == 0) {
          *_nOffset = (uVar1 & 0x800) != 0;
        }
        else {
          *_nOffset = ((uVar1 & 0x1000) != 0 ^ 0xffU) & 1;
        }
        if ((uVar1 & 8) == 0) {
          if ((uVar1 & 0x40) == 0) {
            if ((uVar1 & 0x80) == 0) {
              *in_RDX = 1.0;
              *in_RCX = 0.0;
              *in_R8 = 0.0;
              *in_R9 = 1.0;
            }
            else {
              uVar1 = read<unsigned_short>(0);
              fVar4 = fixed_to_float<14,unsigned_short>(uVar1);
              *in_RDX = fVar4;
              uVar1 = read<unsigned_short>(0);
              fVar4 = fixed_to_float<14,unsigned_short>(uVar1);
              *in_RCX = fVar4;
              uVar1 = read<unsigned_short>(0);
              fVar4 = fixed_to_float<14,unsigned_short>(uVar1);
              *in_R8 = fVar4;
              uVar1 = read<unsigned_short>(0);
              fVar4 = fixed_to_float<14,unsigned_short>(uVar1);
              *in_R9 = fVar4;
            }
          }
          else {
            uVar1 = read<unsigned_short>(0);
            fVar4 = fixed_to_float<14,unsigned_short>(uVar1);
            *in_RDX = fVar4;
            *in_RCX = 0.0;
            *in_R8 = 0.0;
            uVar1 = read<unsigned_short>(0);
            fVar4 = fixed_to_float<14,unsigned_short>(uVar1);
            *in_R9 = fVar4;
          }
        }
        else {
          uVar1 = read<unsigned_short>(0);
          fVar4 = fixed_to_float<14,unsigned_short>(uVar1);
          *in_RDX = fVar4;
          *in_RCX = 0.0;
          *in_R8 = 0.0;
          *in_R9 = *in_RDX;
        }
        return true;
      }
    } while ((uVar1 & 0x20) != 0);
    *_nOffset = 0;
    *in_RDX = 1.0;
    *in_RCX = 0.0;
    *in_R8 = 0.0;
    *in_R9 = 1.0;
  }
  return false;
}

Assistant:

bool GetComponentTransform(const void * pSimpleGlyf, int nCompId, 
									float & flt11, float & flt12, float & flt21, float & flt22, 
									bool & fTransOffset)
{
	using namespace Sfnt;
	
	if (GlyfContourCount(pSimpleGlyf) >= 0)
		return false;

	const Sfnt::SimpleGlyph * pGlyph = reinterpret_cast<const Sfnt::SimpleGlyph *>(pSimpleGlyf);
	// for a composite glyph, the special data begins here
	const uint8 * pbGlyph = reinterpret_cast<const uint8 *>(&pGlyph->end_pts_of_contours[0]);

	uint16 GlyphFlags;
	do 
	{
		GlyphFlags = read(*((uint16 *)pbGlyph));
		pbGlyph += sizeof(uint16);
		if (read(*((uint16 *)pbGlyph)) == nCompId)
		{
			pbGlyph += sizeof(uint16); // skip over glyph id of component
			pbGlyph += GlyphFlags & CompoundGlyph::Arg1Arg2Words  ? 4 : 2; // skip over placement data

			if (fTransOffset) // MS rasterizer
				fTransOffset = !(GlyphFlags & CompoundGlyph::UnscaledOffset); 
			else // Apple rasterizer
				fTransOffset = (GlyphFlags & CompoundGlyph::ScaledOffset) != 0;

			if (GlyphFlags & CompoundGlyph::HaveScale)
			{
				flt11 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
				flt12 = 0;
				flt21 = 0;
				flt22 = flt11;
			}
			else if (GlyphFlags & CompoundGlyph::HaveXAndYScale)
			{
				flt11 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
				flt12 = 0;
				flt21 = 0;
				flt22 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
			}
			else if (GlyphFlags & CompoundGlyph::HaveTwoByTwo)
			{
				flt11 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
				flt12 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
				flt21 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
				flt22 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
			}
			else
			{ // identity transform
				flt11 = 1.0;
				flt12 = 0.0;
				flt21 = 0.0;
				flt22 = 1.0;
			}
			return true;
		}
		pbGlyph += sizeof(uint16); // skip over glyph id of component
		int nOffset = 0;
		nOffset += GlyphFlags & CompoundGlyph::Arg1Arg2Words  ? 4 : 2;
		nOffset += GlyphFlags & CompoundGlyph::HaveScale ? 2 : 0;
		nOffset += GlyphFlags & CompoundGlyph::HaveXAndYScale  ? 4 : 0;
		nOffset += GlyphFlags & CompoundGlyph::HaveTwoByTwo  ? 8 :  0;
		pbGlyph += nOffset;
	} while (GlyphFlags & CompoundGlyph::MoreComponents);

	// didn't find requested component
	fTransOffset = false;
	flt11 = 1;
	flt12 = 0;
	flt21 = 0;
	flt22 = 1;
	return false;
}